

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpn_lex.cpp
# Opt level: O2

string * __thiscall util::Lexer::ReadToken_abi_cxx11_(string *__return_storage_ptr__,Lexer *this)

{
  _Elt_pointer pbVar1;
  bool bVar2;
  string *__return_storage_ptr___00;
  char c;
  char local_59;
  string *local_58;
  code *local_50 [2];
  code *local_40;
  code *local_38;
  
  local_58 = __return_storage_ptr__;
  do {
    local_50[1] = (code *)0x0;
    local_50[0] = ctype_whitespace;
    local_38 = std::_Function_handler<bool_(char),_bool_(*)(char)>::_M_invoke;
    local_40 = std::_Function_handler<bool_(char),_bool_(*)(char)>::_M_manager;
    bVar2 = GetCharIf(this,&local_59,(function<bool_(char)> *)local_50);
    std::_Function_base::~_Function_base((_Function_base *)local_50);
    __return_storage_ptr___00 = local_58;
  } while (bVar2);
  pbVar1 = (this->token_buffer).c.
           super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  if ((this->token_buffer).c.
      super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur == pbVar1) {
    bVar2 = PeekChar(this,&local_59);
    __return_storage_ptr___00 = local_58;
    if (bVar2) {
      bVar2 = ctype_op(local_59);
      if (bVar2) {
        ReadOperator_abi_cxx11_(__return_storage_ptr___00,this);
      }
      else {
        ReadValue_abi_cxx11_(__return_storage_ptr___00,this);
      }
    }
    else {
      (local_58->_M_dataplus)._M_p = (pointer)&local_58->field_2;
      local_58->_M_string_length = 0;
      (local_58->field_2)._M_local_buf[0] = '\0';
    }
  }
  else {
    std::__cxx11::string::string((string *)local_58,(string *)pbVar1);
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::pop_front(&(this->token_buffer).c);
  }
  return __return_storage_ptr___00;
}

Assistant:

std::string Lexer::ReadToken()
	{
		char c;

		while (this->GetCharIf(c, ctype_whitespace)) ; // no loop body

		if (!this->token_buffer.empty())
		{
			std::string token = this->token_buffer.front();
			this->token_buffer.pop();
			return token;
		}

		if (this->PeekChar(c))
		{
			if (ctype_op(c))
			{
				return this->ReadOperator();
			}
			else
			{
				return this->ReadValue();
			}
		}

		return {};
	}